

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O3

Session * __thiscall
FIX::SessionFactory::create(SessionFactory *this,SessionID *sessionID,Dictionary *settings)

{
  string *psVar1;
  _func_int **pp_Var2;
  _Base_ptr *pp_Var3;
  int64_t *piVar4;
  Application *application;
  MessageStoreFactory *messageStoreFactory;
  int iVar5;
  int iVar6;
  SessionFactory *pSVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint startDay;
  uint endDay;
  int endDay_00;
  undefined7 extraout_var;
  Session *this_00;
  ConfigError *pCVar11;
  TimeRange *pTVar12;
  undefined1 local_7c8 [52];
  undefined4 local_794;
  HeartBtInt heartBtInt;
  TimeRange utcLogonTime;
  field_metrics local_6e0;
  TimeRange localLogonTime;
  string defaultApplVerID;
  string connectionType;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_610;
  SessionID *local_608;
  SessionFactory *local_600;
  DateTime local_5f8;
  DateTime local_5e0;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  string local_598;
  string local_578;
  TimeRange utcSessionTime;
  TimeRange local_518;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  int64_t iStack_4c0;
  DataDictionaryProvider dataDictionaryProvider;
  TimeRange localSessionTime;
  
  pp_Var3 = &dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
  dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dataDictionaryProvider,"ConnectionType","");
  Dictionary::getString(&connectionType,settings,(string *)&dataDictionaryProvider,false);
  if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                    (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  iVar10 = std::__cxx11::string::compare((char *)&connectionType);
  if (iVar10 != 0) {
    iVar10 = std::__cxx11::string::compare((char *)&connectionType);
    if (iVar10 != 0) {
      pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
      dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dataDictionaryProvider,"Invalid ConnectionType","");
      ConfigError::ConfigError(pCVar11,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  iVar10 = std::__cxx11::string::compare((char *)&connectionType);
  if (iVar10 == 0) {
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"SessionQualifier","");
    bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
    if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                      (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
    }
    if (bVar8) {
      pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
      dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dataDictionaryProvider,"SessionQualifier cannot be used with acceptor.",
                 "");
      ConfigError::ConfigError(pCVar11,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dataDictionaryProvider,"UseDataDictionary","");
  bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
  if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                    (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  bVar9 = true;
  if (bVar8) {
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"UseDataDictionary","");
    bVar9 = Dictionary::getBool(settings,(string *)&dataDictionaryProvider);
    if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                      (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
    }
  }
  defaultApplVerID._M_dataplus._M_p = (pointer)&defaultApplVerID.field_2;
  defaultApplVerID._M_string_length = 0;
  defaultApplVerID.field_2._M_local_buf[0] = '\0';
  if (sessionID->m_isFIXT == true) {
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"DefaultApplVerID","");
    bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
    if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                      (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
    }
    if (!bVar8) {
      pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
      dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dataDictionaryProvider,"ApplVerID is required for FIXT transport","");
      ConfigError::ConfigError(pCVar11,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    piVar4 = &utcSessionTime.m_startTime.super_DateTime.m_time;
    utcSessionTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&utcSessionTime,"DefaultApplVerID","")
    ;
    Dictionary::getString((string *)&utcLogonTime,settings,(string *)&utcSessionTime,false);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001f55c8;
    heartBtInt.super_IntField.super_FieldBase.m_tag = 8;
    heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p =
         (pointer)&heartBtInt.super_IntField.super_FieldBase.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&heartBtInt.super_IntField.super_FieldBase.m_string,
               utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
               CONCAT44(utcLogonTime.m_startTime.super_DateTime._12_4_,
                        utcLogonTime.m_startTime.super_DateTime.m_date) +
               (long)utcLogonTime.m_startTime.super_DateTime._vptr_DateTime);
    heartBtInt.super_IntField.super_FieldBase.m_data._M_dataplus._M_p =
         (pointer)&heartBtInt.super_IntField.super_FieldBase.m_data.field_2;
    heartBtInt.super_IntField.super_FieldBase.m_data._M_string_length = 0;
    heartBtInt.super_IntField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_length = 0;
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum = 0;
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001f5568;
    Message::toApplVerID((ApplVerID *)&dataDictionaryProvider,(BeginString *)&heartBtInt);
    std::__cxx11::string::_M_assign((string *)&defaultApplVerID);
    FieldBase::~FieldBase((FieldBase *)&dataDictionaryProvider);
    FieldBase::~FieldBase((FieldBase *)&heartBtInt);
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    if (utcSessionTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
      operator_delete(utcSessionTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcSessionTime.m_startTime.super_DateTime.m_time + 1);
    }
  }
  DataDictionaryProvider::DataDictionaryProvider(&dataDictionaryProvider);
  if (bVar9 != false) {
    if (sessionID->m_isFIXT == true) {
      processFixtDataDictionaries(this,sessionID,settings,&dataDictionaryProvider);
    }
    else {
      processFixDataDictionary(this,sessionID,settings,&dataDictionaryProvider);
    }
  }
  psVar1 = &heartBtInt.super_IntField.super_FieldBase.m_string;
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  local_608 = sessionID;
  local_600 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"UseLocalTime","");
  bVar8 = Dictionary::has(settings,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (bVar8) {
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"UseLocalTime","");
    bVar8 = Dictionary::getBool(settings,(string *)&heartBtInt);
    if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
      operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                      (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p +
                             1));
    }
  }
  else {
    bVar8 = false;
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"NonStopSession","");
  bVar9 = Dictionary::has(settings,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (bVar9) {
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"NonStopSession","");
    bVar9 = Dictionary::getBool(settings,(string *)&heartBtInt);
    local_794 = (undefined4)CONCAT71(extraout_var,bVar9);
    if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
      operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                      (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p +
                             1));
    }
  }
  else {
    local_794 = 0;
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"StartDay","");
  startDay = Dictionary::getDay(settings,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,&END_DAY,0x1ce34c);
  endDay = Dictionary::getDay(settings,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  startTime.super_DateTime._8_8_ = (ulong)(uint)startTime.super_DateTime._12_4_ << 0x20;
  startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  startTime.super_DateTime.m_time = 0;
  endTime.super_DateTime._8_8_ = (ulong)(uint)endTime.super_DateTime._12_4_ << 0x20;
  endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  endTime.super_DateTime.m_time = 0;
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
       (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"StartTime","");
  Dictionary::getString((string *)&heartBtInt,settings,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  startTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  startTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  startTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase !=
      &heartBtInt.super_IntField.super_FieldBase.m_string) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
       (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"EndTime","");
  Dictionary::getString((string *)&heartBtInt,settings,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  endTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  endTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  endTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase !=
      &heartBtInt.super_IntField.super_FieldBase.m_string) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  TimeRange::TimeRange(&utcSessionTime,&startTime,&endTime,startDay,endDay);
  heartBtInt.super_IntField.super_FieldBase.m_tag = 0;
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__DateTime_001f72c0;
  heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)(((long)(((int)(startTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c) +
                 (startTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
                 (startTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000);
  utcLogonTime.m_startTime.super_DateTime.m_date = 0;
  local_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&PTR__DateTime_001f72c0;
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f72c0;
  utcLogonTime.m_startTime.super_DateTime.m_time =
       ((long)(((int)(endTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c) +
       (endTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
       (endTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000;
  TimeRange::TimeRange
            (&localSessionTime,(LocalTimeOnly *)&heartBtInt,(LocalTimeOnly *)&utcLogonTime,startDay,
             endDay);
  pTVar12 = &utcSessionTime;
  if (bVar8 != false) {
    pTVar12 = &localSessionTime;
  }
  local_518.m_startTime.super_DateTime.m_date = (pTVar12->m_startTime).super_DateTime.m_date;
  local_518.m_startTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar12->m_startTime).super_DateTime.field_0xc;
  local_518.m_startTime.super_DateTime.m_time = (pTVar12->m_startTime).super_DateTime.m_time;
  local_518.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  local_518.m_endTime.super_DateTime.m_date = (pTVar12->m_endTime).super_DateTime.m_date;
  local_518.m_endTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar12->m_endTime).super_DateTime.field_0xc;
  local_518.m_endTime.super_DateTime.m_time._0_4_ = (int)(pTVar12->m_endTime).super_DateTime.m_time;
  local_518.m_endTime.super_DateTime.m_time._4_4_ =
       *(undefined4 *)((long)&(pTVar12->m_endTime).super_DateTime.m_time + 4);
  local_518.m_endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  local_518.m_startDay = pTVar12->m_startDay;
  local_518.m_endDay = pTVar12->m_endDay;
  local_518.m_useLocalTime = pTVar12->m_useLocalTime;
  if ((int)endDay < 0 && -1 < (int)startDay) {
    pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&heartBtInt,"StartDay used without EndDay","");
    ConfigError::ConfigError(pCVar11,(string *)&heartBtInt);
    __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  if ((int)startDay < 0 && -1 < (int)endDay) {
    pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&heartBtInt,"EndDay used without StartDay","");
    ConfigError::ConfigError(pCVar11,(string *)&heartBtInt);
    __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  if (((char)local_794 != '\0') &&
     ((((-1 < (int)(endDay & startDay) || (startTime.super_DateTime.m_date != 0)) ||
       (startTime.super_DateTime.m_time != 0)) ||
      ((endTime.super_DateTime.m_date != 0 || (endTime.super_DateTime.m_time != 0)))))) {
    pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&heartBtInt,"NonStopSession used with StartTime/EndTime/StartDay/EndDay",""
              );
    ConfigError::ConfigError(pCVar11,(string *)&heartBtInt);
    __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  IntField::IntField(&heartBtInt.super_IntField,0x6c,0);
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f6d80
  ;
  iVar10 = std::__cxx11::string::compare((char *)&connectionType);
  pSVar7 = local_600;
  if (iVar10 == 0) {
    localLogonTime.m_startTime.super_DateTime._vptr_DateTime =
         (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time;
    std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"HeartBtInt","");
    iVar10 = Dictionary::getInt(settings,(string *)&localLogonTime);
    IntField::IntField((IntField *)&utcLogonTime,0x6c,iVar10);
    utcLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__FieldBase_001f6d80;
    heartBtInt.super_IntField.super_FieldBase.m_tag = utcLogonTime.m_startTime.super_DateTime.m_date
    ;
    std::__cxx11::string::_M_assign((string *)&heartBtInt.super_IntField.super_FieldBase.m_string);
    heartBtInt.super_IntField.super_FieldBase.m_metrics = local_6e0;
    heartBtInt.super_IntField.super_FieldBase.m_data._M_string_length = 0;
    *heartBtInt.super_IntField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)&utcLogonTime);
    if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      localLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    iVar10 = IntField::getValue(&heartBtInt.super_IntField);
    if (iVar10 < 1) {
      pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
      utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
           (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&utcLogonTime,"Heartbeat must be greater than zero","");
      ConfigError::ConfigError(pCVar11,(string *)&utcLogonTime);
      __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  this_00 = (Session *)operator_new(0x878);
  local_638._M_unused._M_object = (void *)0x0;
  local_638._8_8_ = 0;
  local_620 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
              ::_M_invoke;
  local_628 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
              ::_M_manager;
  application = pSVar7->m_application;
  messageStoreFactory = pSVar7->m_messageStoreFactory;
  iVar10 = IntField::getValue(&heartBtInt.super_IntField);
  Session::Session(this_00,(function<FIX::UtcTimeStamp_()> *)&local_638,application,
                   messageStoreFactory,local_608,&dataDictionaryProvider,&local_518,iVar10,
                   pSVar7->m_pLogFactory);
  if (local_628 != (code *)0x0) {
    (*local_628)(&local_638,&local_638,__destroy_functor);
  }
  std::__cxx11::string::_M_assign((string *)&this_00->m_senderDefaultApplVerID);
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
       (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"LogonDay","");
  iVar10 = Dictionary::getDay(settings,(string *)&utcLogonTime);
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
       (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"LogoutDay","");
  endDay_00 = Dictionary::getDay(settings,(string *)&utcLogonTime);
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  local_5e0.m_date = startTime.super_DateTime.m_date;
  local_5e0._12_4_ = startTime.super_DateTime._12_4_;
  local_5e0.m_time = startTime.super_DateTime.m_time;
  local_5e0._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  local_5f8.m_date = endTime.super_DateTime.m_date;
  local_5f8._12_4_ = endTime.super_DateTime._12_4_;
  local_5f8.m_time = endTime.super_DateTime.m_time;
  local_5f8._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5a60;
  piVar4 = &localLogonTime.m_startTime.super_DateTime.m_time;
  localLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"LogonTime","");
  Dictionary::getString((string *)&utcLogonTime,settings,(string *)&localLogonTime,false);
  UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_7c8,(string *)&utcLogonTime);
  local_5e0.m_time = local_7c8._16_8_;
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
    operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    localLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  localLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"LogoutTime","");
  Dictionary::getString((string *)&utcLogonTime,settings,(string *)&localLogonTime,false);
  UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_7c8,(string *)&utcLogonTime);
  local_5f8.m_time = local_7c8._16_8_;
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
      (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
    operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    localLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  TimeRange::TimeRange
            (&utcLogonTime,(UtcTimeOnly *)&local_5e0,(UtcTimeOnly *)&local_5f8,iVar10,endDay_00);
  local_7c8._8_4_ = _S_red;
  local_7c8._0_8_ = local_610;
  local_7c8._16_8_ =
       ((long)(((int)(local_5e0.m_time / 60000000000) % 0x3c) * 0x3c) +
       (local_5e0.m_time / 3600000000000) * 0xe10 + (local_5e0.m_time / 1000000000) % 0x3c) *
       1000000000;
  local_578._M_string_length._0_4_ = 0;
  local_578._M_dataplus._M_p = (pointer)local_610;
  local_578.field_2._M_allocated_capacity =
       ((long)(((int)(local_5f8.m_time / 60000000000) % 0x3c) * 0x3c) +
       (local_5f8.m_time / 3600000000000) * 0xe10 + (local_5f8.m_time / 1000000000) % 0x3c) *
       1000000000;
  TimeRange::TimeRange
            (&localLogonTime,(LocalTimeOnly *)local_7c8,(LocalTimeOnly *)&local_578,iVar10,endDay_00
            );
  pTVar12 = &utcLogonTime;
  if (bVar8 != false) {
    pTVar12 = &localLogonTime;
  }
  local_4c8 = *(undefined8 *)&(pTVar12->m_startTime).super_DateTime.m_date;
  iStack_4c0 = (pTVar12->m_startTime).super_DateTime.m_time;
  local_4d8 = *(undefined8 *)&(pTVar12->m_endTime).super_DateTime.m_date;
  uStack_4d0 = (pTVar12->m_endTime).super_DateTime.m_time;
  iVar5 = pTVar12->m_startDay;
  iVar6 = pTVar12->m_endDay;
  bVar8 = pTVar12->m_useLocalTime;
  bVar9 = TimeRange::isInRange(&local_518,&local_5e0,iVar10);
  if (bVar9) {
    bVar9 = TimeRange::isInRange(&local_518,&local_5f8,endDay_00);
    if (bVar9) {
      *(undefined8 *)&(this_00->m_logonTime).m_startTime.super_DateTime.m_date = local_4c8;
      (this_00->m_logonTime).m_startTime.super_DateTime.m_time = iStack_4c0;
      (this_00->m_logonTime).m_endTime.super_DateTime.m_date = (int)local_4d8;
      *(undefined4 *)&(this_00->m_logonTime).m_endTime.super_DateTime.field_0xc = local_4d8._4_4_;
      *(undefined4 *)&(this_00->m_logonTime).m_endTime.super_DateTime.m_time =
           (undefined4)uStack_4d0;
      *(undefined4 *)((long)&(this_00->m_logonTime).m_endTime.super_DateTime.m_time + 4) =
           uStack_4d0._4_4_;
      (this_00->m_logonTime).m_startDay = iVar5;
      (this_00->m_logonTime).m_endDay = iVar6;
      (this_00->m_logonTime).m_useLocalTime = bVar8;
      pp_Var2 = (_func_int **)(local_7c8 + 0x10);
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7c8,"SendRedundantResendRequests","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7c8,"SendRedundantResendRequests","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_sendRedundantResendRequests = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CheckCompID","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CheckCompID","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_checkCompId = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CheckLatency","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"CheckLatency","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_checkLatency = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"MaxLatency","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"MaxLatency","");
        iVar10 = Dictionary::getInt(settings,(string *)local_7c8);
        this_00->m_maxLatency = iVar10;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"LogonTimeout","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"LogonTimeout","");
        iVar10 = Dictionary::getInt(settings,(string *)local_7c8);
        (this_00->m_state).m_logonTimeout = iVar10;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"LogoutTimeout","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"LogoutTimeout","");
        iVar10 = Dictionary::getInt(settings,(string *)local_7c8);
        (this_00->m_state).m_logoutTimeout = iVar10;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnLogon","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnLogon","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_resetOnLogon = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnLogout","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnLogout","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_resetOnLogout = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnDisconnect","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"ResetOnDisconnect","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_resetOnDisconnect = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"RefreshOnLogon","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"RefreshOnLogon","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_refreshOnLogon = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7c8,"MillisecondsInTimeStamp","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7c8,"MillisecondsInTimeStamp","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_timestampPrecision = (uint)bVar8 + (uint)bVar8 * 2;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"PersistMessages","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"PersistMessages","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_persistMessages = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7c8,"ValidateLengthAndChecksum","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7c8,"ValidateLengthAndChecksum","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_validateLengthAndChecksum = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7c8,"SendNextExpectedMsgSeqNum","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_7c8._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7c8,"SendNextExpectedMsgSeqNum","");
        bVar8 = Dictionary::getBool(settings,(string *)local_7c8);
        this_00->m_sendNextExpectedMsgSeqNum = bVar8;
        if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
          operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
        }
      }
      if ((char)local_794 != '\0') {
        this_00->m_isNonStopSession = true;
      }
      local_7c8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7c8,"AllowedRemoteAddresses","");
      bVar8 = Dictionary::has(settings,(string *)local_7c8);
      if ((_func_int **)local_7c8._0_8_ != pp_Var2) {
        operator_delete((void *)local_7c8._0_8_,local_7c8._16_8_ + 1);
      }
      if (bVar8) {
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_598,"AllowedRemoteAddresses","");
        Dictionary::getString(&local_578,settings,&local_598,false);
        string_split((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_7c8,&local_578,',');
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(this_00->m_allowedRemoteAddresses)._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_7c8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_7c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
      }
      FieldBase::~FieldBase((FieldBase *)&heartBtInt);
      DataDictionary::~DataDictionary(&dataDictionaryProvider.emptyDataDictionary);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
      ::~_Rb_tree(&dataDictionaryProvider.m_applicationDictionaries._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
                   *)&dataDictionaryProvider);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultApplVerID._M_dataplus._M_p != &defaultApplVerID.field_2) {
        operator_delete(defaultApplVerID._M_dataplus._M_p,
                        CONCAT71(defaultApplVerID.field_2._M_allocated_capacity._1_7_,
                                 defaultApplVerID.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)connectionType._M_dataplus._M_p != &connectionType.field_2) {
        operator_delete(connectionType._M_dataplus._M_p,
                        connectionType.field_2._M_allocated_capacity + 1);
      }
      return this_00;
    }
    pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_7c8._0_8_ = local_7c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7c8,"LogoutTime must be between StartTime and EndTime","");
    ConfigError::ConfigError(pCVar11,(string *)local_7c8);
    __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  pCVar11 = (ConfigError *)__cxa_allocate_exception(0x50);
  local_7c8._0_8_ = local_7c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7c8,"LogonTime must be between StartTime and EndTime","");
  ConfigError::ConfigError(pCVar11,(string *)local_7c8);
  __cxa_throw(pCVar11,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  std::string connectionType = settings.getString(CONNECTION_TYPE);
  if (connectionType != "acceptor" && connectionType != "initiator") {
    throw ConfigError("Invalid ConnectionType");
  }

  if (connectionType == "acceptor" && settings.has(SESSION_QUALIFIER)) {
    throw ConfigError("SessionQualifier cannot be used with acceptor.");
  }

  bool useDataDictionary = true;
  if (settings.has(USE_DATA_DICTIONARY)) {
    useDataDictionary = settings.getBool(USE_DATA_DICTIONARY);
  }

  std::string defaultApplVerID;
  if (sessionID.isFIXT()) {
    if (!settings.has(DEFAULT_APPLVERID)) {
      throw ConfigError("ApplVerID is required for FIXT transport");
    }
    defaultApplVerID = Message::toApplVerID(settings.getString(DEFAULT_APPLVERID));
  }

  DataDictionaryProvider dataDictionaryProvider;
  if (useDataDictionary) {
    if (sessionID.isFIXT()) {
      processFixtDataDictionaries(sessionID, settings, dataDictionaryProvider);
    } else {
      processFixDataDictionary(sessionID, settings, dataDictionaryProvider);
    }
  }

  bool useLocalTime = false;
  if (settings.has(USE_LOCAL_TIME)) {
    useLocalTime = settings.getBool(USE_LOCAL_TIME);
  }

  bool isNonStopSession = false;
  if (settings.has(NON_STOP_SESSION)) {
    isNonStopSession = settings.getBool(NON_STOP_SESSION);
  }

  int startDay = -1;
  int endDay = -1;
  try {
    startDay = settings.getDay(START_DAY);
    endDay = settings.getDay(END_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly startTime = UtcTimeOnly(0, 0, 0);
  UtcTimeOnly endTime = UtcTimeOnly(0, 0, 0);
  try {
    startTime = UtcTimeOnlyConvertor::convert(settings.getString(START_TIME));
    endTime = UtcTimeOnlyConvertor::convert(settings.getString(END_TIME));
  } catch (ConfigError &e) {
    if (!isNonStopSession) {
      throw e;
    }
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcSessionTime(startTime, endTime, startDay, endDay);
  TimeRange localSessionTime(
      LocalTimeOnly(startTime.getHour(), startTime.getMinute(), startTime.getSecond()),
      LocalTimeOnly(endTime.getHour(), endTime.getMinute(), endTime.getSecond()),
      startDay,
      endDay);
  TimeRange sessionTimeRange = useLocalTime ? localSessionTime : utcSessionTime;

  if (startDay >= 0 && endDay < 0) {
    throw ConfigError("StartDay used without EndDay");
  }
  if (endDay >= 0 && startDay < 0) {
    throw ConfigError("EndDay used without StartDay");
  }

  if (isNonStopSession
      && (startDay >= 0 || endDay >= 0 || startTime != UtcTimeOnly(0, 0, 0) || endTime != UtcTimeOnly(0, 0, 0))) {
    throw ConfigError("NonStopSession used with StartTime/EndTime/StartDay/EndDay");
  }

  HeartBtInt heartBtInt(0);
  if (connectionType == "initiator") {
    heartBtInt = HeartBtInt(settings.getInt(HEARTBTINT));
    if (heartBtInt <= 0) {
      throw ConfigError("Heartbeat must be greater than zero");
    }
  }

  std::unique_ptr<Session> pSession;
  pSession.reset(new Session(
      []() { return UtcTimeStamp::now(); },
      m_application,
      m_messageStoreFactory,
      sessionID,
      dataDictionaryProvider,
      sessionTimeRange,
      heartBtInt,
      m_pLogFactory));

  pSession->setSenderDefaultApplVerID(defaultApplVerID);

  int logonDay = startDay;
  int logoutDay = endDay;
  try {
    logonDay = settings.getDay(LOGON_DAY);
    logoutDay = settings.getDay(LOGOUT_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly logonTime(startTime);
  UtcTimeOnly logoutTime(endTime);
  try {
    logonTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGON_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  try {
    logoutTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGOUT_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcLogonTime(logonTime, logoutTime, logonDay, logoutDay);
  TimeRange localLogonTime(
      LocalTimeOnly(logonTime.getHour(), logonTime.getMinute(), logonTime.getSecond()),
      LocalTimeOnly(logoutTime.getHour(), logoutTime.getMinute(), logoutTime.getSecond()),
      logonDay,
      logoutDay);
  TimeRange logonTimeRange = useLocalTime ? localLogonTime : utcLogonTime;

  if (!sessionTimeRange.isInRange(logonTime, logonDay)) {
    throw ConfigError("LogonTime must be between StartTime and EndTime");
  }
  if (!sessionTimeRange.isInRange(logoutTime, logoutDay)) {
    throw ConfigError("LogoutTime must be between StartTime and EndTime");
  }
  pSession->setLogonTime(logonTimeRange);

  if (settings.has(SEND_REDUNDANT_RESENDREQUESTS)) {
    pSession->setSendRedundantResendRequests(settings.getBool(SEND_REDUNDANT_RESENDREQUESTS));
  }
  if (settings.has(CHECK_COMPID)) {
    pSession->setCheckCompId(settings.getBool(CHECK_COMPID));
  }
  if (settings.has(CHECK_LATENCY)) {
    pSession->setCheckLatency(settings.getBool(CHECK_LATENCY));
  }
  if (settings.has(MAX_LATENCY)) {
    pSession->setMaxLatency(settings.getInt(MAX_LATENCY));
  }
  if (settings.has(LOGON_TIMEOUT)) {
    pSession->setLogonTimeout(settings.getInt(LOGON_TIMEOUT));
  }
  if (settings.has(LOGOUT_TIMEOUT)) {
    pSession->setLogoutTimeout(settings.getInt(LOGOUT_TIMEOUT));
  }
  if (settings.has(RESET_ON_LOGON)) {
    pSession->setResetOnLogon(settings.getBool(RESET_ON_LOGON));
  }
  if (settings.has(RESET_ON_LOGOUT)) {
    pSession->setResetOnLogout(settings.getBool(RESET_ON_LOGOUT));
  }
  if (settings.has(RESET_ON_DISCONNECT)) {
    pSession->setResetOnDisconnect(settings.getBool(RESET_ON_DISCONNECT));
  }
  if (settings.has(REFRESH_ON_LOGON)) {
    pSession->setRefreshOnLogon(settings.getBool(REFRESH_ON_LOGON));
  }
  if (settings.has(MILLISECONDS_IN_TIMESTAMP)) {
    pSession->setMillisecondsInTimeStamp(settings.getBool(MILLISECONDS_IN_TIMESTAMP));
  }
  if (settings.has(PERSIST_MESSAGES)) {
    pSession->setPersistMessages(settings.getBool(PERSIST_MESSAGES));
  }
  if (settings.has(VALIDATE_LENGTH_AND_CHECKSUM)) {
    pSession->setValidateLengthAndChecksum(settings.getBool(VALIDATE_LENGTH_AND_CHECKSUM));
  }
  if (settings.has(SEND_NEXT_EXPECTED_MSG_SEQ_NUM)) {
    pSession->setSendNextExpectedMsgSeqNum(settings.getBool(SEND_NEXT_EXPECTED_MSG_SEQ_NUM));
  }
  if (isNonStopSession) {
    pSession->setIsNonStopSession(isNonStopSession);
  }
  if (settings.has(ALLOWED_REMOTE_ADDRESSES)) {
    pSession->setAllowedRemoteAddresses(string_split(settings.getString(ALLOWED_REMOTE_ADDRESSES), ','));
  }

  return pSession.release();
}